

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O2

uint64_t color_cell_compression
                   (uint32_t mode,color_cell_compressor_params *pParams,
                   color_cell_compressor_results *pResults,
                   bc7enc_compress_block_params *pComp_params)

{
  uint uVar1;
  long lVar2;
  bc7enc_bool bVar3;
  byte bVar4;
  undefined2 uVar5;
  uint32_t uVar6;
  color_quad_u8 *pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  color_quad_u8 *pcVar11;
  uint32_t i;
  int iVar12;
  ulong uVar13;
  uint64_t uVar14;
  ulong uVar15;
  int iVar16;
  char cVar17;
  int hy;
  long lVar18;
  uint uVar19;
  uint32_t i_5;
  bool bVar20;
  uint uVar21;
  undefined8 uVar22;
  uint uVar24;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar23 [16];
  float fVar25;
  float fVar27;
  undefined8 in_XMM1_Qb;
  undefined1 auVar26 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 in_XMM4_Ba;
  undefined1 uVar33;
  undefined1 in_XMM4_Bb;
  undefined1 uVar34;
  undefined1 in_XMM4_Bc;
  undefined1 uVar35;
  undefined1 in_XMM4_Bd;
  undefined1 uVar36;
  undefined1 in_XMM4_Be;
  undefined1 uVar37;
  undefined1 in_XMM4_Bf;
  undefined1 uVar38;
  undefined1 in_XMM4_Bg;
  undefined1 uVar39;
  undefined1 in_XMM4_Bh;
  undefined1 uVar40;
  float fVar41;
  float fVar42;
  undefined2 uVar60;
  float fVar55;
  undefined1 auVar52 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  vec4F vVar59;
  vec4F xl;
  vec4F xl_00;
  vec4F xl_01;
  vec4F xl_02;
  vec4F xl_03;
  vec4F xh;
  vec4F xh_00;
  vec4F xh_01;
  vec4F xh_02;
  vec4F xh_03;
  vec4F xh_04;
  vec4F local_168;
  vec4F local_158;
  uint8_t selectors_temp1 [16];
  vec4F local_128;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  vec4F local_f8;
  uint8_t selectors_temp [16];
  uint32_t local_d8 [2];
  uint8_t *puStack_d0;
  uint8_t *local_c8;
  vec4F c1;
  vec4F c0;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar53 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar54 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar43 [16];
  
  pResults->m_best_overall_err = 0xffffffffffffffff;
  if (mode == 1) {
    pcVar7 = pParams->m_pPixels;
    uVar15 = (ulong)pParams->m_num_pixels;
    uVar13 = 1;
    do {
      if (uVar15 <= uVar13) {
        uVar14 = pack_mode1_to_one_color
                           (pParams,pResults,(uint)pcVar7->m_c[0],(uint)pcVar7->m_c[1],
                            (uint)pcVar7->m_c[2],pResults->m_pSelectors);
        return uVar14;
      }
    } while (((pcVar7->m_c[0] == pcVar7[uVar13].m_c[0]) && (pcVar7->m_c[1] == pcVar7[uVar13].m_c[1])
             ) && (pcVar11 = pcVar7 + uVar13, uVar13 = uVar13 + 1, pcVar7->m_c[2] == pcVar11->m_c[2]
                  ));
  }
  else {
    uVar15 = (ulong)pParams->m_num_pixels;
    if (mode == 7) {
      pcVar7 = pParams->m_pPixels;
      uVar13 = 1;
      do {
        if (uVar15 <= uVar13) {
          uVar14 = pack_mode7_to_one_color
                             (pParams,pResults,(uint)pcVar7->m_c[0],(uint)pcVar7->m_c[1],
                              (uint)pcVar7->m_c[2],(uint)pcVar7->m_c[3],pResults->m_pSelectors,
                              pParams->m_num_pixels,pcVar7);
          return uVar14;
        }
      } while ((((pcVar7->m_c[0] == pcVar7[uVar13].m_c[0]) &&
                (pcVar7->m_c[1] == pcVar7[uVar13].m_c[1])) &&
               (pcVar7->m_c[2] == pcVar7[uVar13].m_c[2])) &&
              (pcVar11 = pcVar7 + uVar13, uVar13 = uVar13 + 1, pcVar7->m_c[3] == pcVar11->m_c[3]));
    }
  }
  lVar2 = uVar15 * 4;
  fVar30 = 0.0;
  fVar32 = 0.0;
  fStack_100 = 0.0;
  fStack_fc = 0.0;
  uVar24 = CONCAT13(in_XMM4_Bd,CONCAT12(in_XMM4_Bc,CONCAT11(in_XMM4_Bb,in_XMM4_Ba))) ^
           CONCAT13(in_XMM4_Bd,CONCAT12(in_XMM4_Bc,CONCAT11(in_XMM4_Bb,in_XMM4_Ba)));
  uVar33 = (undefined1)uVar24;
  uVar34 = (undefined1)(uVar24 >> 8);
  uVar35 = (undefined1)(uVar24 >> 0x10);
  uVar36 = (undefined1)(uVar24 >> 0x18);
  uVar24 = CONCAT13(in_XMM4_Bh,CONCAT12(in_XMM4_Bg,CONCAT11(in_XMM4_Bf,in_XMM4_Be))) ^
           CONCAT13(in_XMM4_Bh,CONCAT12(in_XMM4_Bg,CONCAT11(in_XMM4_Bf,in_XMM4_Be)));
  uVar37 = (undefined1)uVar24;
  uVar38 = (undefined1)(uVar24 >> 8);
  uVar39 = (undefined1)(uVar24 >> 0x10);
  uVar40 = (undefined1)(uVar24 >> 0x18);
  fVar41 = 0.0;
  fVar42 = 0.0;
  for (lVar18 = 0; lVar2 - lVar18 != 0; lVar18 = lVar18 + 4) {
    local_118[1] = uVar34;
    local_118[0] = uVar33;
    local_118[2] = uVar35;
    local_118[3] = uVar36;
    local_118[4] = uVar37;
    local_118[5] = uVar38;
    local_118[6] = uVar39;
    local_118[7] = uVar40;
    uStack_110._0_4_ = fVar41;
    uStack_110._4_4_ = fVar42;
    local_108 = fVar30;
    fStack_104 = fVar32;
    vVar59 = vec4F_from_color((color_quad_u8 *)(pParams->m_pPixels->m_c + lVar18));
    fVar30 = local_108 + vVar59.m_c[0];
    fVar32 = fStack_104 + vVar59.m_c[1];
    fStack_100 = fStack_100 + (float)extraout_XMM0_Qb;
    fStack_fc = fStack_fc + (float)((ulong)extraout_XMM0_Qb >> 0x20);
    fVar25 = (float)local_118._0_4_ + vVar59.m_c[2];
    uVar33 = SUB41(fVar25,0);
    uVar34 = (undefined1)((uint)fVar25 >> 8);
    uVar35 = (undefined1)((uint)fVar25 >> 0x10);
    uVar36 = (undefined1)((uint)fVar25 >> 0x18);
    fVar41 = (float)local_118._4_4_ + vVar59.m_c[3];
    uVar37 = SUB41(fVar41,0);
    uVar38 = (undefined1)((uint)fVar41 >> 8);
    uVar39 = (undefined1)((uint)fVar41 >> 0x10);
    uVar40 = (undefined1)((uint)fVar41 >> 0x18);
    fVar41 = (float)uStack_110 + (float)in_XMM1_Qb;
    fVar42 = uStack_110._4_4_ + (float)((ulong)in_XMM1_Qb >> 0x20);
    local_f8.m_c[1] = fVar32;
    local_f8.m_c[0] = fVar30;
    local_f8.m_c[3]._0_1_ = uVar37;
    local_f8.m_c[2] = fVar25;
    local_f8.m_c[3]._1_1_ = uVar38;
    local_f8.m_c[3]._2_1_ = uVar39;
    local_f8.m_c[3]._3_1_ = uVar40;
  }
  fVar25 = 1.0 / (float)uVar15;
  local_118._4_4_ = fVar25 * fVar32;
  local_118._0_4_ = fVar25 * fVar30;
  uStack_110._0_4_ = fVar25 * fStack_100;
  uStack_110._4_4_ = fVar25 * fStack_fc;
  local_108 = fVar25 * (float)CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33)));
  fStack_104 = fVar25 * (float)CONCAT13(uVar40,CONCAT12(uVar39,CONCAT11(uVar38,uVar37)));
  fStack_100 = fVar25 * fVar41;
  fStack_fc = fVar25 * fVar42;
  fVar41 = 1.0 / ((float)uVar15 * 255.0);
  local_f8.m_c[1] = fVar32 * fVar41;
  local_f8.m_c[0] = fVar30 * fVar41;
  local_f8.m_c[3] = fVar41 * (float)CONCAT13(uVar40,CONCAT12(uVar39,CONCAT11(uVar38,uVar37)));
  local_f8.m_c[2] = fVar41 * (float)CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33)));
  vec4F_saturate_in_place(&local_f8);
  bVar3 = pParams->m_has_alpha;
  if (bVar3 == '\0') {
    uVar24 = CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33))) ^
             CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33)));
    uVar21 = CONCAT13(uVar40,CONCAT12(uVar39,CONCAT11(uVar38,uVar37))) ^
             CONCAT13(uVar40,CONCAT12(uVar39,CONCAT11(uVar38,uVar37)));
    fVar30 = 0.0;
    fVar32 = 0.0;
    fVar41 = 0.0;
    fVar42 = 0.0;
    fVar25 = 0.0;
    fVar27 = 0.0;
    for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
      uVar5 = *(undefined2 *)pParams->m_pPixels[uVar13].m_c;
      auVar51._0_15_ = ZEXT415(0);
      auVar51[0xf] = (char)(uVar21 >> 0x18);
      auVar50._14_2_ = auVar51._14_2_;
      auVar50._0_13_ = ZEXT413(0);
      auVar50[0xd] = (char)(uVar21 >> 0x10);
      auVar49._13_3_ = auVar50._13_3_;
      auVar49._0_13_ = ZEXT413(0);
      auVar48._12_4_ = auVar49._12_4_;
      auVar48._0_11_ = ZEXT411(0);
      auVar48[0xb] = (char)(uVar21 >> 8);
      auVar47._11_5_ = auVar48._11_5_;
      auVar47._0_11_ = ZEXT411(0);
      auVar46._10_6_ = auVar47._10_6_;
      auVar46._0_9_ = (unkuint9)0;
      auVar46[9] = (char)uVar21;
      auVar45._9_7_ = auVar46._9_7_;
      auVar45._0_9_ = (unkuint9)0;
      auVar9._1_8_ = auVar45._8_8_;
      auVar9[0] = (char)(uVar24 >> 0x18);
      auVar9._9_7_ = 0;
      auVar8._1_10_ = SUB1610(auVar9 << 0x38,6);
      auVar8[0] = (char)(uVar24 >> 0x10);
      auVar8._11_5_ = 0;
      auVar44._4_12_ = SUB1612(auVar8 << 0x28,4);
      auVar44[3] = (char)(uVar24 >> 8);
      auVar44[2] = (char)((ushort)uVar5 >> 8);
      auVar44._0_2_ = uVar5;
      auVar43._2_14_ = auVar44._2_14_;
      uVar60 = CONCAT11((char)uVar24,(char)uVar5);
      auVar54._0_12_ = auVar43._0_12_;
      auVar54._12_2_ = SUB162(auVar9 << 0x38,6);
      auVar54._14_2_ = (short)(uVar21 >> 0x10);
      auVar53._12_4_ = auVar54._12_4_;
      auVar53._0_10_ = auVar43._0_10_;
      auVar53._10_2_ = (short)uVar21;
      auVar52._10_6_ = auVar53._10_6_;
      auVar52._0_8_ = auVar43._0_8_;
      auVar52._8_2_ = SUB162(auVar8 << 0x28,4);
      auVar10._4_8_ = auVar52._8_8_;
      auVar10._2_2_ = (short)(uVar24 >> 0x10);
      auVar10._0_2_ = auVar44._2_2_;
      fVar31 = (float)CONCAT22((short)uVar24,uVar60) - (float)local_118._0_4_;
      fVar55 = (float)auVar10._0_4_ - (float)local_118._4_4_;
      fVar56 = (float)pParams->m_pPixels[uVar13].m_c[2] - local_108;
      fVar25 = fVar25 + fVar31 * fVar31;
      fVar27 = fVar27 + fVar31 * fVar55;
      fVar32 = fVar32 + fVar55 * fVar55;
      fVar41 = fVar41 + fVar56 * fVar31;
      fVar42 = fVar42 + fVar56 * fVar55;
      fVar30 = fVar30 + fVar56 * fVar56;
    }
    local_128.m_c[0] = 0.9;
    local_128.m_c[1] = 1.0;
    uVar33 = 0x33;
    uVar34 = 0x33;
    uVar35 = 0x33;
    uVar36 = 0x3f;
    iVar12 = 3;
    while (bVar20 = iVar12 != 0, iVar12 = iVar12 + -1, bVar20) {
      fVar57 = (float)CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33))) * fVar30 +
               local_128.m_c[0] * fVar41 + fVar42 * local_128.m_c[1];
      fVar31 = (float)CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33)));
      fVar55 = fVar31 * fVar41 + local_128.m_c[0] * fVar25 + local_128.m_c[1] * fVar27;
      fVar31 = fVar31 * fVar42 + local_128.m_c[0] * fVar27 + local_128.m_c[1] * fVar32;
      fVar56 = ABS(fVar55);
      if (ABS(fVar55) <= ABS(fVar31)) {
        fVar56 = ABS(fVar31);
      }
      if (fVar56 <= ABS(fVar57)) {
        fVar56 = ABS(fVar57);
      }
      fVar58 = 1.0 / fVar56;
      if (1e-10 < fVar56) {
        fVar57 = fVar57 * fVar58;
      }
      uVar24 = (int)((uint)(1e-10 < fVar56) << 0x1f) >> 0x1f;
      uVar21 = (int)((uint)(1e-10 < fVar56) << 0x1f) >> 0x1f;
      local_128.m_c[0] = (float)(~uVar24 & (uint)fVar55 | (uint)(fVar58 * fVar55) & uVar24);
      local_128.m_c[1] = (float)(~uVar21 & (uint)fVar31 | (uint)(fVar58 * fVar31) & uVar21);
      uVar33 = SUB41(fVar57,0);
      uVar34 = (undefined1)((uint)fVar57 >> 8);
      uVar35 = (undefined1)((uint)fVar57 >> 0x10);
      uVar36 = (undefined1)((uint)fVar57 >> 0x18);
    }
    fVar30 = (float)CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33))) *
             (float)CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33))) +
             local_128.m_c[0] * local_128.m_c[0] + local_128.m_c[1] * local_128.m_c[1];
    if (1e-10 <= fVar30) {
      fVar30 = 1.0 / SQRT(fVar30);
      local_128.m_c[2] = (float)CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33))) * fVar30;
      uVar33 = SUB41(local_128.m_c[2],0);
      uVar34 = (undefined1)((uint)local_128.m_c[2] >> 8);
      uVar35 = (undefined1)((uint)local_128.m_c[2] >> 0x10);
      uVar36 = (undefined1)((uint)local_128.m_c[2] >> 0x18);
      local_128.m_c[0] = local_128.m_c[0] * fVar30;
      local_128.m_c[1] = local_128.m_c[1] * fVar30;
      local_128.m_c[3] = 0.0;
    }
    else {
      local_128.m_c[0] = 0.0;
      local_128.m_c[1] = 0.0;
      local_128.m_c[2] = 0.0;
      local_128.m_c[3] = 0.0;
      uVar24 = CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33))) ^
               CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33)));
      uVar33 = (undefined1)uVar24;
      uVar34 = (undefined1)(uVar24 >> 8);
      uVar35 = (undefined1)(uVar24 >> 0x10);
      uVar36 = (undefined1)(uVar24 >> 0x18);
    }
  }
  else {
    local_128.m_c[0] = 0.0;
    local_128.m_c[1] = 0.0;
    local_128.m_c[2] = 0.0;
    local_128.m_c[3] = 0.0;
    for (lVar18 = 0; fVar42 = local_128.m_c[3], fVar41 = local_128.m_c[2], fVar32 = local_128.m_c[1]
        , fVar30 = local_128.m_c[0], lVar2 - lVar18 != 0; lVar18 = lVar18 + 4) {
      vVar59 = vec4F_from_color((color_quad_u8 *)(pParams->m_pPixels->m_c + lVar18));
      uVar22._0_4_ = vVar59.m_c[0] - (float)local_118._0_4_;
      uVar22._4_4_ = vVar59.m_c[1] - (float)local_118._4_4_;
      fVar25 = vVar59.m_c[2] - local_108;
      fVar27 = vVar59.m_c[3] - fStack_104;
      if (lVar18 == 0) {
        selectors_temp._12_4_ = fVar27;
        selectors_temp._8_4_ = fVar25;
        selectors_temp._0_8_ = uVar22;
      }
      else {
        selectors_temp._4_4_ = local_128.m_c[1];
        selectors_temp._0_4_ = local_128.m_c[0];
        selectors_temp._12_4_ = local_128.m_c[3];
        selectors_temp._8_4_ = local_128.m_c[2];
      }
      vec4F_normalize_in_place((vec4F *)selectors_temp);
      local_128.m_c[0] =
           fVar30 + (float)selectors_temp._12_4_ * fVar27 * (float)uVar22 +
                    (float)selectors_temp._8_4_ * fVar25 * (float)uVar22 +
                    (float)selectors_temp._0_4_ * (float)uVar22 * (float)uVar22 +
                    (float)selectors_temp._4_4_ * (float)uVar22 * uVar22._4_4_;
      local_128.m_c[1] =
           fVar32 + (float)selectors_temp._12_4_ * fVar27 * uVar22._4_4_ +
                    (float)selectors_temp._8_4_ * fVar25 * uVar22._4_4_ +
                    (float)selectors_temp._0_4_ * (float)uVar22 * uVar22._4_4_ +
                    (float)selectors_temp._4_4_ * uVar22._4_4_ * uVar22._4_4_;
      local_128.m_c[2] =
           fVar41 + (float)selectors_temp._12_4_ * fVar27 * fVar25 +
                    (float)selectors_temp._8_4_ * fVar25 * fVar25 +
                    (float)selectors_temp._0_4_ * (float)uVar22 * fVar25 +
                    (float)selectors_temp._4_4_ * uVar22._4_4_ * fVar25;
      local_128.m_c[3] =
           fVar42 + (float)selectors_temp._12_4_ * fVar27 * fVar27 +
                    (float)selectors_temp._8_4_ * fVar27 * fVar25 +
                    (float)selectors_temp._0_4_ * fVar27 * (float)uVar22 +
                    (float)selectors_temp._4_4_ * fVar27 * uVar22._4_4_;
    }
    vec4F_normalize_in_place(&local_128);
    uVar33 = SUB41(local_128.m_c[2],0);
    uVar34 = (undefined1)((uint)local_128.m_c[2] >> 8);
    uVar35 = (undefined1)((uint)local_128.m_c[2] >> 0x10);
    uVar36 = (undefined1)((uint)local_128.m_c[2] >> 0x18);
  }
  if (local_128.m_c[3] * local_128.m_c[3] +
      (float)CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33))) *
      (float)CONCAT13(uVar36,CONCAT12(uVar35,CONCAT11(uVar34,uVar33))) +
      local_128.m_c[0] * local_128.m_c[0] + local_128.m_c[1] * local_128.m_c[1] < 0.5) {
    bVar20 = pParams->m_perceptual == '\0';
    local_128.m_c[0] = *(float *)(&DAT_0011d0f0 + (ulong)bVar20 * 4);
    uVar24 = (uint)bVar20;
    uVar21 = (int)(uVar24 << 0x1f) >> 0x1f;
    uVar24 = (int)(uVar24 << 0x1f) >> 0x1f;
    local_128.m_c[1] = (float)(uVar21 & 0x3f800000 | ~uVar21 & 0x3f370a3d);
    local_128.m_c[2] = (float)(uVar24 & 0x3f800000 | ~uVar24 & 0x3d9374bc);
    local_128.m_c[3] = 0.0;
    if (bVar3 != '\0') {
      local_128.m_c[3] = local_128.m_c[1];
    }
    vec4F_normalize_in_place(&local_128);
  }
  fVar42 = local_128.m_c[3];
  fVar41 = local_128.m_c[2];
  fVar32 = local_128.m_c[1];
  fVar30 = local_128.m_c[0];
  fVar25 = 1e+09;
  fVar27 = -1e+09;
  for (lVar18 = 0; lVar2 - lVar18 != 0; lVar18 = lVar18 + 4) {
    vVar59 = vec4F_from_color((color_quad_u8 *)(pParams->m_pPixels->m_c + lVar18));
    fVar31 = (vVar59.m_c[3] - fStack_104) * fVar42 +
             (vVar59.m_c[2] - local_108) * fVar41 +
             (vVar59.m_c[0] - (float)local_118._0_4_) * fVar30 +
             (vVar59.m_c[1] - (float)local_118._4_4_) * fVar32;
    if (fVar31 <= fVar25) {
      fVar25 = fVar31;
    }
    if (fVar27 <= fVar31) {
      fVar27 = fVar31;
    }
  }
  fVar25 = fVar25 * 0.003921569;
  fVar27 = fVar27 * 0.003921569;
  uVar22 = 0;
  c0.m_c[0] = fVar25 * fVar30 + local_f8.m_c[0];
  c0.m_c[1] = fVar25 * fVar32 + local_f8.m_c[1];
  c0.m_c[3] = fVar25 * fVar42 + local_f8.m_c[3];
  c0.m_c[2] = fVar25 * fVar41 + local_f8.m_c[2];
  c1.m_c[0] = fVar30 * fVar27 + local_f8.m_c[0];
  c1.m_c[1] = fVar32 * fVar27 + local_f8.m_c[1];
  c1.m_c[2] = fVar27 * fVar41 + local_f8.m_c[2];
  c1.m_c[3] = fVar27 * fVar42 + local_f8.m_c[3];
  vVar59 = vec4F_saturate(&c0);
  local_108 = vVar59.m_c[0];
  fStack_104 = vVar59.m_c[1];
  fStack_100 = (float)extraout_XMM0_Qb_00;
  fStack_fc = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  uStack_110 = uVar22;
  local_118 = (undefined1  [8])vVar59.m_c._8_8_;
  vVar59 = vec4F_saturate(&c1);
  auVar26._0_8_ = vVar59.m_c._8_8_;
  auVar26._8_8_ = uVar22;
  auVar23._0_8_ = vVar59.m_c._0_8_;
  auVar23._8_8_ = extraout_XMM0_Qb_01;
  fVar30 = local_118._0_4_;
  fVar32 = local_118._4_4_;
  auVar29._4_4_ = fStack_104;
  auVar29._0_4_ = local_108;
  auVar29._8_4_ = fStack_100;
  auVar29._12_4_ = fStack_fc;
  if (fVar32 + fVar30 + fStack_104 + local_108 <=
      vVar59.m_c[3] + vVar59.m_c[2] + vVar59.m_c[1] + vVar59.m_c[0]) {
    auVar28._8_4_ = (int)extraout_XMM0_Qb_01;
    auVar28._0_8_ = auVar23._0_8_;
    auVar28._12_4_ = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
    auVar23 = auVar29;
    auVar26 = _local_118;
    auVar29 = auVar28;
    fVar30 = vVar59.m_c[2];
    fVar32 = vVar59.m_c[3];
  }
  vVar59.m_c._0_8_ = auVar23._0_8_;
  vVar59.m_c._8_8_ = auVar26._0_8_;
  xh.m_c._0_8_ = auVar29._0_8_;
  xh.m_c[3] = fVar32;
  xh.m_c[2] = fVar30;
  uVar14 = find_optimal_solution(mode,vVar59,xh,pParams,pResults);
  if (uVar14 != 0) {
    if (pComp_params->m_try_least_squares != '\0') {
      selectors_temp[0] = '\0';
      selectors_temp[1] = '\0';
      selectors_temp[2] = '\0';
      selectors_temp[3] = '\0';
      selectors_temp[4] = '\0';
      selectors_temp[5] = '\0';
      selectors_temp[6] = '\0';
      selectors_temp[7] = '\0';
      selectors_temp[8] = '\0';
      selectors_temp[9] = '\0';
      selectors_temp[10] = '\0';
      selectors_temp[0xb] = '\0';
      selectors_temp[0xc] = '\0';
      selectors_temp[0xd] = '\0';
      selectors_temp[0xe] = '\0';
      selectors_temp[0xf] = '\0';
      selectors_temp1[0] = '\0';
      selectors_temp1[1] = '\0';
      selectors_temp1[2] = '\0';
      selectors_temp1[3] = '\0';
      selectors_temp1[4] = '\0';
      selectors_temp1[5] = '\0';
      selectors_temp1[6] = '\0';
      selectors_temp1[7] = '\0';
      selectors_temp1[8] = '\0';
      selectors_temp1[9] = '\0';
      selectors_temp1[10] = '\0';
      selectors_temp1[0xb] = '\0';
      selectors_temp1[0xc] = '\0';
      selectors_temp1[0xd] = '\0';
      selectors_temp1[0xe] = '\0';
      selectors_temp1[0xf] = '\0';
      if (pParams->m_has_alpha == '\0') {
        compute_least_squares_endpoints_rgb
                  (pParams->m_num_pixels,pResults->m_pSelectors,pParams->m_pSelector_weightsx,
                   (vec4F *)selectors_temp,(vec4F *)selectors_temp1,pParams->m_pPixels);
      }
      else {
        compute_least_squares_endpoints_rgba
                  (pParams->m_num_pixels,pResults->m_pSelectors,pParams->m_pSelector_weightsx,
                   (vec4F *)selectors_temp,(vec4F *)selectors_temp1,pParams->m_pPixels);
      }
      xl.m_c[0] = (float)selectors_temp._0_8_ * 0.003921569;
      xl.m_c[1] = SUB84(selectors_temp._0_8_,4) * 0.003921569;
      xl.m_c[2] = (float)selectors_temp._8_8_ * 0.003921569;
      xl.m_c[3] = SUB84(selectors_temp._8_8_,4) * 0.003921569;
      xh_00.m_c[0] = (float)selectors_temp1._0_8_ * 0.003921569;
      xh_00.m_c[1] = SUB84(selectors_temp1._0_8_,4) * 0.003921569;
      xh_00.m_c[2] = (float)selectors_temp1._8_8_ * 0.003921569;
      xh_00.m_c[3] = SUB84(selectors_temp1._8_8_,4) * 0.003921569;
      uVar14 = find_optimal_solution(mode,xl,xh_00,pParams,pResults);
      if (uVar14 == 0) {
        return 0;
      }
    }
    if (pComp_params->m_uber_level == 0) {
LAB_00107bb0:
      if (mode == 1) {
        local_c8 = pResults->m_pSelectors_temp;
        selectors_temp._0_8_ = pResults->m_best_overall_err;
        selectors_temp[8] = (pResults->m_low_endpoint).m_c[0];
        selectors_temp[9] = (pResults->m_low_endpoint).m_c[1];
        selectors_temp[10] = (pResults->m_low_endpoint).m_c[2];
        selectors_temp[0xb] = (pResults->m_low_endpoint).m_c[3];
        selectors_temp[0xc] = (pResults->m_high_endpoint).m_c[0];
        selectors_temp[0xd] = (pResults->m_high_endpoint).m_c[1];
        selectors_temp[0xe] = (pResults->m_high_endpoint).m_c[2];
        selectors_temp[0xf] = (pResults->m_high_endpoint).m_c[3];
        local_d8 = *&pResults->m_pbits;
        puStack_d0 = pResults->m_pSelectors;
        uVar15 = pack_mode1_to_one_color
                           (pParams,(color_cell_compressor_results *)selectors_temp,
                            (int)(local_f8.m_c[0] * 255.0 + 0.5),
                            (int)(local_f8.m_c[1] * 255.0 + 0.5),
                            (int)(local_f8.m_c[2] * 255.0 + 0.5),pResults->m_pSelectors_temp);
      }
      else {
        if (mode != 7) {
          return pResults->m_best_overall_err;
        }
        local_c8 = pResults->m_pSelectors_temp;
        selectors_temp._0_8_ = pResults->m_best_overall_err;
        selectors_temp[8] = (pResults->m_low_endpoint).m_c[0];
        selectors_temp[9] = (pResults->m_low_endpoint).m_c[1];
        selectors_temp[10] = (pResults->m_low_endpoint).m_c[2];
        selectors_temp[0xb] = (pResults->m_low_endpoint).m_c[3];
        selectors_temp[0xc] = (pResults->m_high_endpoint).m_c[0];
        selectors_temp[0xd] = (pResults->m_high_endpoint).m_c[1];
        selectors_temp[0xe] = (pResults->m_high_endpoint).m_c[2];
        selectors_temp[0xf] = (pResults->m_high_endpoint).m_c[3];
        local_d8 = *&pResults->m_pbits;
        puStack_d0 = pResults->m_pSelectors;
        uVar15 = pack_mode7_to_one_color
                           (pParams,(color_cell_compressor_results *)selectors_temp,
                            (int)(local_f8.m_c[0] * 255.0 + 0.5),
                            (int)(local_f8.m_c[1] * 255.0 + 0.5),
                            (int)(local_f8.m_c[2] * 255.0 + 0.5),
                            (int)(local_f8.m_c[3] * 255.0 + 0.5),pResults->m_pSelectors_temp,
                            pParams->m_num_pixels,pParams->m_pPixels);
      }
      if (uVar15 < pResults->m_best_overall_err) {
        *&pResults->m_pbits = local_d8;
        pResults->m_pSelectors = puStack_d0;
        pResults->m_pSelectors_temp = local_c8;
        pResults->m_best_overall_err = selectors_temp._0_8_;
        (pResults->m_low_endpoint).m_c[0] = selectors_temp[8];
        (pResults->m_low_endpoint).m_c[1] = selectors_temp[9];
        (pResults->m_low_endpoint).m_c[2] = selectors_temp[10];
        (pResults->m_low_endpoint).m_c[3] = selectors_temp[0xb];
        (pResults->m_high_endpoint).m_c[0] = selectors_temp[0xc];
        (pResults->m_high_endpoint).m_c[1] = selectors_temp[0xd];
        (pResults->m_high_endpoint).m_c[2] = selectors_temp[0xe];
        (pResults->m_high_endpoint).m_c[3] = selectors_temp[0xf];
        memcpy(pResults->m_pSelectors,local_c8,(ulong)pParams->m_num_pixels);
        pResults->m_best_overall_err = uVar15;
        return uVar15;
      }
      return pResults->m_best_overall_err;
    }
    uVar24 = pParams->m_num_pixels;
    uVar13 = (ulong)uVar24;
    memcpy(selectors_temp,pResults->m_pSelectors,uVar13);
    uVar6 = pParams->m_num_selector_weights;
    uVar21 = 0x10;
    uVar19 = 0;
    for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      bVar4 = selectors_temp[uVar15];
      if (bVar4 <= uVar21) {
        uVar21 = (uint)bVar4;
      }
      if (uVar19 <= bVar4) {
        uVar19 = (uint)bVar4;
      }
    }
    uVar1 = uVar6 - 1;
    for (uVar15 = 0; uVar13 != uVar15; uVar15 = uVar15 + 1) {
      bVar4 = selectors_temp[uVar15];
      selectors_temp1[uVar15] = bVar4 + ((bVar4 <= uVar1 && uVar1 != bVar4) && uVar21 == bVar4);
    }
    local_158.m_c[0] = 0.0;
    local_158.m_c[1] = 0.0;
    local_158.m_c[2] = 0.0;
    local_158.m_c[3] = 0.0;
    local_168.m_c = (float  [4])ZEXT816(0);
    if (pParams->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                (uVar24,selectors_temp1,pParams->m_pSelector_weightsx,&local_158,&local_168,
                 pParams->m_pPixels);
    }
    else {
      compute_least_squares_endpoints_rgba
                (uVar24,selectors_temp1,pParams->m_pSelector_weightsx,&local_158,&local_168,
                 pParams->m_pPixels);
    }
    fVar30 = local_158.m_c[1];
    local_158.m_c[0] = local_158.m_c[0] * 0.003921569;
    local_158.m_c[1] = fVar30 * 0.003921569;
    fVar30 = local_158.m_c[3];
    local_158.m_c[2] = local_158.m_c[2] * 0.003921569;
    local_158.m_c[3] = fVar30 * 0.003921569;
    xh_01.m_c[0] = local_168.m_c[0] * 0.003921569;
    xh_01.m_c[1] = local_168.m_c[1] * 0.003921569;
    xh_01.m_c[2] = local_168.m_c[2] * 0.003921569;
    xh_01.m_c[3] = local_168.m_c[3] * 0.003921569;
    local_168.m_c[1]._0_1_ = SUB41(xh_01.m_c[1],0);
    local_168.m_c[0] = xh_01.m_c[0];
    local_168.m_c[1]._1_1_ = (char)((uint)xh_01.m_c[1] >> 8);
    local_168.m_c[1]._2_1_ = (char)((uint)xh_01.m_c[1] >> 0x10);
    local_168.m_c[1]._3_1_ = (char)((uint)xh_01.m_c[1] >> 0x18);
    local_168.m_c[2] = xh_01.m_c[2];
    local_168.m_c[3] = xh_01.m_c[3];
    xl_00.m_c[2] = local_158.m_c[2];
    xl_00.m_c[3] = local_158.m_c[3];
    xl_00.m_c[0] = local_158.m_c[0];
    xl_00.m_c[1] = local_158.m_c[1];
    uVar14 = find_optimal_solution(mode,xl_00,xh_01,pParams,pResults);
    if (uVar14 != 0) {
      uVar24 = pParams->m_num_pixels;
      for (uVar15 = 0; uVar24 != uVar15; uVar15 = uVar15 + 1) {
        bVar4 = selectors_temp[uVar15];
        selectors_temp1[uVar15] = bVar4 - (uVar19 == bVar4 && bVar4 != 0);
      }
      if (pParams->m_has_alpha == '\0') {
        compute_least_squares_endpoints_rgb
                  (uVar24,selectors_temp1,pParams->m_pSelector_weightsx,&local_158,&local_168,
                   pParams->m_pPixels);
      }
      else {
        compute_least_squares_endpoints_rgba
                  (uVar24,selectors_temp1,pParams->m_pSelector_weightsx,&local_158,&local_168,
                   pParams->m_pPixels);
      }
      fVar30 = local_158.m_c[1];
      local_158.m_c[0] = local_158.m_c[0] * 0.003921569;
      local_158.m_c[1] = fVar30 * 0.003921569;
      fVar30 = local_158.m_c[3];
      local_158.m_c[2] = local_158.m_c[2] * 0.003921569;
      local_158.m_c[3] = fVar30 * 0.003921569;
      xh_02.m_c[0] = local_168.m_c[0] * 0.003921569;
      xh_02.m_c[1] = local_168.m_c[1] * 0.003921569;
      xh_02.m_c[2] = local_168.m_c[2] * 0.003921569;
      xh_02.m_c[3] = local_168.m_c[3] * 0.003921569;
      local_168.m_c[1]._0_1_ = SUB41(xh_02.m_c[1],0);
      local_168.m_c[0] = xh_02.m_c[0];
      local_168.m_c[1]._1_1_ = (char)((uint)xh_02.m_c[1] >> 8);
      local_168.m_c[1]._2_1_ = (char)((uint)xh_02.m_c[1] >> 0x10);
      local_168.m_c[1]._3_1_ = (char)((uint)xh_02.m_c[1] >> 0x18);
      local_168.m_c[2] = xh_02.m_c[2];
      local_168.m_c[3] = xh_02.m_c[3];
      xl_01.m_c[2] = local_158.m_c[2];
      xl_01.m_c[3] = local_158.m_c[3];
      xl_01.m_c[0] = local_158.m_c[0];
      xl_01.m_c[1] = local_158.m_c[1];
      uVar14 = find_optimal_solution(mode,xl_01,xh_02,pParams,pResults);
      if (uVar14 != 0) {
        uVar24 = pParams->m_num_pixels;
        for (uVar15 = 0; uVar24 != uVar15; uVar15 = uVar15 + 1) {
          bVar4 = selectors_temp[uVar15];
          if ((uVar21 != bVar4) || (cVar17 = '\x01', pParams->m_num_selector_weights - 1 <= uVar21))
          {
            cVar17 = -(bVar4 != 0 && uVar19 == bVar4);
          }
          selectors_temp1[uVar15] = bVar4 + cVar17;
        }
        if (pParams->m_has_alpha == '\0') {
          compute_least_squares_endpoints_rgb
                    (uVar24,selectors_temp1,pParams->m_pSelector_weightsx,&local_158,&local_168,
                     pParams->m_pPixels);
        }
        else {
          compute_least_squares_endpoints_rgba
                    (uVar24,selectors_temp1,pParams->m_pSelector_weightsx,&local_158,&local_168,
                     pParams->m_pPixels);
        }
        xl_02.m_c[0] = local_158.m_c[0] * 0.003921569;
        xl_02.m_c[1] = local_158.m_c[1] * 0.003921569;
        xl_02.m_c[2] = local_158.m_c[2] * 0.003921569;
        xl_02.m_c[3] = local_158.m_c[3] * 0.003921569;
        xh_03.m_c[0] = local_168.m_c[0] * 0.003921569;
        xh_03.m_c[1] = local_168.m_c[1] * 0.003921569;
        xh_03.m_c[2] = local_168.m_c[2] * 0.003921569;
        xh_03.m_c[3] = local_168.m_c[3] * 0.003921569;
        uVar14 = find_optimal_solution(mode,xl_02,xh_03,pParams,pResults);
        if (uVar14 != 0) {
          uVar24 = pComp_params->m_uber_level;
          if ((1 < uVar24) &&
             ((ulong)(pParams->m_num_pixels * 0x38 >> 4) < pResults->m_best_overall_err)) {
            iVar12 = 1;
            if (3 < uVar24) {
              iVar12 = uVar24 - 2;
            }
            fVar30 = (float)(int)uVar1;
            local_118._0_4_ = fVar30;
            for (iVar16 = -iVar12; iVar16 < 2; iVar16 = iVar16 + 1) {
              local_108 = (float)iVar16;
              for (uVar24 = uVar6 - 2; (int)uVar24 <= (int)(iVar12 + uVar1); uVar24 = uVar24 + 1) {
                if (uVar24 != uVar1 || iVar16 != 0) {
                  uVar21 = pParams->m_num_pixels;
                  fVar32 = (float)(int)uVar24 - local_108;
                  for (uVar15 = 0; uVar21 != uVar15; uVar15 = uVar15 + 1) {
                    fVar42 = floorf((((float)selectors_temp[uVar15] - local_108) * fVar30) / fVar32
                                    + 0.5);
                    fVar30 = (float)local_118._0_4_;
                    fVar41 = 0.0;
                    if ((0.0 <= fVar42) && (fVar41 = fVar42, (float)local_118._0_4_ < fVar42)) {
                      fVar41 = (float)local_118._0_4_;
                    }
                    selectors_temp1[uVar15] = (uint8_t)(int)fVar41;
                  }
                  local_158.m_c[0] = 0.0;
                  local_158.m_c[1] = 0.0;
                  local_158.m_c[2] = 0.0;
                  local_158.m_c[3] = 0.0;
                  local_168.m_c = (float  [4])ZEXT816(0);
                  if (pParams->m_has_alpha == '\0') {
                    compute_least_squares_endpoints_rgb
                              (uVar21,selectors_temp1,pParams->m_pSelector_weightsx,&local_158,
                               &local_168,pParams->m_pPixels);
                  }
                  else {
                    compute_least_squares_endpoints_rgba
                              (uVar21,selectors_temp1,pParams->m_pSelector_weightsx,&local_158,
                               &local_168,pParams->m_pPixels);
                  }
                  fVar30 = local_158.m_c[1];
                  local_158.m_c[0] = local_158.m_c[0] * 0.003921569;
                  local_158.m_c[1] = fVar30 * 0.003921569;
                  fVar30 = local_158.m_c[3];
                  local_158.m_c[2] = local_158.m_c[2] * 0.003921569;
                  local_158.m_c[3] = fVar30 * 0.003921569;
                  xh_04.m_c[0] = local_168.m_c[0] * 0.003921569;
                  xh_04.m_c[1] = local_168.m_c[1] * 0.003921569;
                  xh_04.m_c[2] = local_168.m_c[2] * 0.003921569;
                  xh_04.m_c[3] = local_168.m_c[3] * 0.003921569;
                  local_168.m_c[1]._0_1_ = SUB41(xh_04.m_c[1],0);
                  local_168.m_c[0] = xh_04.m_c[0];
                  local_168.m_c[1]._1_1_ = (char)((uint)xh_04.m_c[1] >> 8);
                  local_168.m_c[1]._2_1_ = (char)((uint)xh_04.m_c[1] >> 0x10);
                  local_168.m_c[1]._3_1_ = (char)((uint)xh_04.m_c[1] >> 0x18);
                  local_168.m_c[2] = xh_04.m_c[2];
                  local_168.m_c[3] = xh_04.m_c[3];
                  xl_03.m_c[2] = local_158.m_c[2];
                  xl_03.m_c[3] = local_158.m_c[3];
                  xl_03.m_c[0] = local_158.m_c[0];
                  xl_03.m_c[1] = local_158.m_c[1];
                  uVar14 = find_optimal_solution(mode,xl_03,xh_04,pParams,pResults);
                  fVar30 = (float)local_118._0_4_;
                  if (uVar14 == 0) {
                    return 0;
                  }
                }
              }
            }
          }
          goto LAB_00107bb0;
        }
      }
    }
  }
  return 0;
}

Assistant:

static uint64_t color_cell_compression(uint32_t mode, const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, const bc7enc_compress_block_params *pComp_params)
{
	assert((mode == 6) || (mode == 7) || (!pParams->m_has_alpha));

	pResults->m_best_overall_err = UINT64_MAX;

	// If the partition's colors are all the same in mode 1, then just pack them as a single color.
	if (mode == 1)
	{
		const uint32_t cr = pParams->m_pPixels[0].m_c[0], cg = pParams->m_pPixels[0].m_c[1], cb = pParams->m_pPixels[0].m_c[2];

		bc7enc_bool allSame = BC7ENC_TRUE;
		for (uint32_t i = 1; i < pParams->m_num_pixels; i++)
		{
			if ((cr != pParams->m_pPixels[i].m_c[0]) || (cg != pParams->m_pPixels[i].m_c[1]) || (cb != pParams->m_pPixels[i].m_c[2]))
			{
				allSame = BC7ENC_FALSE;
				break;
			}
		}

		if (allSame)
			return pack_mode1_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
	}
	else if (mode == 7)
	{
		const uint32_t cr = pParams->m_pPixels[0].m_c[0], cg = pParams->m_pPixels[0].m_c[1], cb = pParams->m_pPixels[0].m_c[2], ca = pParams->m_pPixels[0].m_c[3];

		bc7enc_bool allSame = BC7ENC_TRUE;
		for (uint32_t i = 1; i < pParams->m_num_pixels; i++)
		{
			if ((cr != pParams->m_pPixels[i].m_c[0]) || (cg != pParams->m_pPixels[i].m_c[1]) || (cb != pParams->m_pPixels[i].m_c[2]) || (ca != pParams->m_pPixels[i].m_c[3]))
			{
				allSame = BC7ENC_FALSE;
				break;
			}
		}

		if (allSame)
			return pack_mode7_to_one_color(pParams, pResults, cr, cg, cb, ca, pResults->m_pSelectors, pParams->m_num_pixels, pParams->m_pPixels);
	}

	// Compute partition's mean color and principle axis.
	vec4F meanColor, axis;
	vec4F_set_scalar(&meanColor, 0.0f);

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
		meanColor = vec4F_add(&meanColor, &color);
	}
				
	vec4F meanColorScaled = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels));

	meanColor = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels * 255.0f));
	vec4F_saturate_in_place(&meanColor);

	if (pParams->m_has_alpha)
	{
		// Use incremental PCA for RGBA PCA, because it's simple.
		vec4F_set_scalar(&axis, 0.0f);
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
			color = vec4F_sub(&color, &meanColorScaled);
			vec4F a = vec4F_mul(&color, color.m_c[0]);
			vec4F b = vec4F_mul(&color, color.m_c[1]);
			vec4F c = vec4F_mul(&color, color.m_c[2]);
			vec4F d = vec4F_mul(&color, color.m_c[3]);
			vec4F n = i ? axis : color;
			vec4F_normalize_in_place(&n);
			axis.m_c[0] += vec4F_dot(&a, &n);
			axis.m_c[1] += vec4F_dot(&b, &n);
			axis.m_c[2] += vec4F_dot(&c, &n);
			axis.m_c[3] += vec4F_dot(&d, &n);
		}
		vec4F_normalize_in_place(&axis);
	}
	else
	{
		// Use covar technique for RGB PCA, because it doesn't require per-pixel normalization.
		float cov[6] = { 0, 0, 0, 0, 0, 0 };

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			const color_quad_u8 *pV = &pParams->m_pPixels[i];
			float r = pV->m_c[0] - meanColorScaled.m_c[0];
			float g = pV->m_c[1] - meanColorScaled.m_c[1];
			float b = pV->m_c[2] - meanColorScaled.m_c[2];
			cov[0] += r*r; cov[1] += r*g; cov[2] += r*b; cov[3] += g*g; cov[4] += g*b; cov[5] += b*b;
		}

		float vfr = .9f, vfg = 1.0f, vfb = .7f;
		for (uint32_t iter = 0; iter < 3; iter++)
		{
			float r = vfr*cov[0] + vfg*cov[1] + vfb*cov[2];
			float g = vfr*cov[1] + vfg*cov[3] + vfb*cov[4];
			float b = vfr*cov[2] + vfg*cov[4] + vfb*cov[5];

			float m = maximumf(maximumf(fabsf(r), fabsf(g)), fabsf(b));
			if (m > 1e-10f)
			{
				m = 1.0f / m;
				r *= m; g *= m;	b *= m;
			}

			vfr = r; vfg = g; vfb = b;
		}

		float len = vfr*vfr + vfg*vfg + vfb*vfb;
		if (len < 1e-10f)
			vec4F_set_scalar(&axis, 0.0f);
		else
		{
			len = 1.0f / sqrtf(len);
			vfr *= len; vfg *= len; vfb *= len;
			vec4F_set(&axis, vfr, vfg, vfb, 0);
		}
	}

	// TODO: Try picking the 2 colors with the largest projection onto the axis, instead of computing new colors along the axis.
				
	if (vec4F_dot(&axis, &axis) < .5f)
	{
		if (pParams->m_perceptual)
			vec4F_set(&axis, .213f, .715f, .072f, pParams->m_has_alpha ? .715f : 0);
		else
			vec4F_set(&axis, 1.0f, 1.0f, 1.0f, pParams->m_has_alpha ? 1.0f : 0);
		vec4F_normalize_in_place(&axis);
	}

	float l = 1e+9f, h = -1e+9f;

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);

		vec4F q = vec4F_sub(&color, &meanColorScaled);
		float d = vec4F_dot(&q, &axis);

		l = minimumf(l, d);
		h = maximumf(h, d);
	}

	l *= (1.0f / 255.0f);
	h *= (1.0f / 255.0f);

	vec4F b0 = vec4F_mul(&axis, l);
	vec4F b1 = vec4F_mul(&axis, h);
	vec4F c0 = vec4F_add(&meanColor, &b0);
	vec4F c1 = vec4F_add(&meanColor, &b1);
	vec4F minColor = vec4F_saturate(&c0);
	vec4F maxColor = vec4F_saturate(&c1);
				
	vec4F whiteVec;
	vec4F_set_scalar(&whiteVec, 1.0f);

	if (vec4F_dot(&minColor, &whiteVec) > vec4F_dot(&maxColor, &whiteVec))
	{
#if 0
		// Don't compile correctly with VC 2019 in release.
		vec4F temp = minColor;
		minColor = maxColor;
		maxColor = temp;
#else
		float a = minColor.m_c[0], b = minColor.m_c[1], c = minColor.m_c[2], d = minColor.m_c[3];
		minColor.m_c[0] = maxColor.m_c[0];
		minColor.m_c[1] = maxColor.m_c[1];
		minColor.m_c[2] = maxColor.m_c[2];
		minColor.m_c[3] = maxColor.m_c[3];
		maxColor.m_c[0] = a;
		maxColor.m_c[1] = b;
		maxColor.m_c[2] = c;
		maxColor.m_c[3] = d;
#endif
	}

	// First find a solution using the block's PCA.
	if (!find_optimal_solution(mode, minColor, maxColor, pParams, pResults))
		return 0;
	
	if (pComp_params->m_try_least_squares)
	{
		// Now try to refine the solution using least squares by computing the optimal endpoints from the current selectors.
		vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;
	}
	
	if (pComp_params->m_uber_level > 0)
	{
		// In uber level 1, try varying the selectors a little, somewhat like cluster fit would. First try incrementing the minimum selectors,
		// then try decrementing the selectrors, then try both.
		uint8_t selectors_temp[16], selectors_temp1[16];
		memcpy(selectors_temp, pResults->m_pSelectors, pParams->m_num_pixels);

		const int max_selector = pParams->m_num_selector_weights - 1;

		uint32_t min_sel = 16;
		uint32_t max_sel = 0;
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			min_sel = minimumu(min_sel, sel);
			max_sel = maximumu(max_sel, sel);
		}

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			selectors_temp1[i] = (uint8_t)sel;
		}

		vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			else if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		// In uber levels 2+, try taking more advantage of endpoint extrapolation by scaling the selectors in one direction or another.
		const uint32_t uber_err_thresh = (pParams->m_num_pixels * 56) >> 4;
		if ((pComp_params->m_uber_level >= 2) && (pResults->m_best_overall_err > uber_err_thresh))
		{
			const int Q = (pComp_params->m_uber_level >= 4) ? (pComp_params->m_uber_level - 2) : 1;
			for (int ly = -Q; ly <= 1; ly++)
			{
				for (int hy = max_selector - 1; hy <= (max_selector + Q); hy++)
				{
					if ((ly == 0) && (hy == max_selector))
						continue;

					for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
						selectors_temp1[i] = (uint8_t)clampf(floorf((float)max_selector * ((float)selectors_temp[i] - (float)ly) / ((float)hy - (float)ly) + .5f), 0, (float)max_selector);

					//vec4F xl, xh;
					vec4F_set_scalar(&xl, 0.0f);
					vec4F_set_scalar(&xh, 0.0f);
					if (pParams->m_has_alpha)
						compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
					else
						compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

					xl = vec4F_mul(&xl, (1.0f / 255.0f));
					xh = vec4F_mul(&xh, (1.0f / 255.0f));

					if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
						return 0;
				}
			}
		}
	}

	if (mode == 1)
	{
		// Try encoding the partition as a single color by using the optimal singe colors tables to encode the block to its mean.
		color_cell_compressor_results avg_results = *pResults;
		const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
		uint64_t avg_err = pack_mode1_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
		if (avg_err < pResults->m_best_overall_err)
		{
			*pResults = avg_results;
			memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
			pResults->m_best_overall_err = avg_err;
		}
	}
	else if (mode == 7)
	{
		// Try encoding the partition as a single color by using the optimal singe colors tables to encode the block to its mean.
		color_cell_compressor_results avg_results = *pResults;
		const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f), a = (int)(.5f + meanColor.m_c[3] * 255.0f);
		uint64_t avg_err = pack_mode7_to_one_color(pParams, &avg_results, r, g, b, a, pResults->m_pSelectors_temp, pParams->m_num_pixels, pParams->m_pPixels);
		if (avg_err < pResults->m_best_overall_err)
		{
			*pResults = avg_results;
			memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
			pResults->m_best_overall_err = avg_err;
		}
	}
				
	return pResults->m_best_overall_err;
}